

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O1

StrWriter * __thiscall
moira::StrWriter::operator<<(StrWriter *this,IxMit<(moira::Mode)10,_2> wrapper)

{
  uint uVar1;
  i32 iVar2;
  Int IVar3;
  Syntax SVar4;
  char *pcVar5;
  Int IVar6;
  char cVar7;
  Rn rn;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  long lVar11;
  short sVar12;
  uint uVar13;
  ushort uVar14;
  Scale s;
  
  uVar1 = (wrapper.ea)->ext1;
  if ((uVar1 >> 8 & 1) == 0) {
    operator<<(this);
    cVar7 = '@';
    lVar11 = 0;
    do {
      pcVar10 = this->ptr;
      this->ptr = pcVar10 + 1;
      *pcVar10 = cVar7;
      cVar7 = ")@("[lVar11 + 2];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 2);
    operator<<(this,(Int)(int)(char)uVar1);
    pcVar10 = this->ptr;
    this->ptr = pcVar10 + 1;
    *pcVar10 = ',';
    s.raw = uVar1 >> 9 & 3;
    operator<<(this,(Rn)(uVar1 >> 0xc & 0xf));
    pcVar10 = ":l";
    if ((uVar1 >> 0xb & 1) == 0) {
      pcVar10 = ":w";
    }
    cVar7 = *pcVar10;
    while (cVar7 != '\0') {
      pcVar10 = pcVar10 + 1;
      pcVar5 = this->ptr;
      this->ptr = pcVar5 + 1;
      *pcVar5 = cVar7;
      cVar7 = *pcVar10;
    }
  }
  else {
    uVar13 = uVar1 & 0xffff;
    rn.raw = uVar13 >> 0xc;
    uVar8 = uVar13 >> 0xb;
    s.raw = uVar1 >> 9 & 3;
    uVar9 = uVar13 >> 7;
    uVar13 = uVar13 >> 6;
    uVar14 = (ushort)(uVar1 >> 4) & 3;
    iVar2 = (wrapper.ea)->ext2;
    sVar12 = (short)iVar2;
    if ((uVar1 & 7) == 0) {
      if ((uVar9 & 1) == 0) {
        operator<<();
      }
      else {
        operator<<(this);
      }
      cVar7 = '@';
      lVar11 = 0;
      do {
        pcVar10 = this->ptr;
        this->ptr = pcVar10 + 1;
        *pcVar10 = cVar7;
        cVar7 = ")@("[lVar11 + 2];
        lVar11 = lVar11 + 1;
      } while (lVar11 != 2);
      IVar3.raw = (int)sVar12;
      if (uVar14 == 3) {
        IVar3.raw = iVar2;
      }
      operator<<(this,IVar3);
      if ((uVar13 & 1) != 0) goto LAB_0028c9e8;
      pcVar10 = this->ptr;
      this->ptr = pcVar10 + 1;
      *pcVar10 = ',';
      SVar4 = this->style->syntax;
      if ((SVar4 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar4 & 0x1f) & 1) != 0)) {
        pcVar10 = this->ptr;
        this->ptr = pcVar10 + 1;
        *pcVar10 = ' ';
      }
      operator<<(this,rn);
      pcVar10 = ":l";
      if ((uVar8 & 1) == 0) {
        pcVar10 = ":w";
      }
      cVar7 = *pcVar10;
      while (cVar7 != '\0') {
        pcVar10 = pcVar10 + 1;
        pcVar5 = this->ptr;
        this->ptr = pcVar5 + 1;
        *pcVar5 = cVar7;
        cVar7 = *pcVar10;
      }
    }
    else {
      IVar3.raw = (wrapper.ea)->ext3;
      if ((uVar1 & 4) == 0) {
        if ((uVar9 & 1) == 0) {
          operator<<();
        }
        else {
          operator<<(this);
        }
        cVar7 = '@';
        lVar11 = 0;
        do {
          pcVar10 = this->ptr;
          this->ptr = pcVar10 + 1;
          *pcVar10 = cVar7;
          cVar7 = ")@("[lVar11 + 2];
          lVar11 = lVar11 + 1;
        } while (lVar11 != 2);
        IVar6.raw = (int)sVar12;
        if (uVar14 == 3) {
          IVar6.raw = iVar2;
        }
        operator<<(this,IVar6);
        if ((uVar13 & 1) == 0) {
          pcVar10 = this->ptr;
          this->ptr = pcVar10 + 1;
          *pcVar10 = ',';
          SVar4 = this->style->syntax;
          if ((SVar4 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar4 & 0x1f) & 1) != 0)) {
            pcVar10 = this->ptr;
            this->ptr = pcVar10 + 1;
            *pcVar10 = ' ';
          }
          operator<<(this,rn);
          pcVar10 = ":l";
          if ((uVar8 & 1) == 0) {
            pcVar10 = ":w";
          }
          cVar7 = *pcVar10;
          while (cVar7 != '\0') {
            pcVar10 = pcVar10 + 1;
            pcVar5 = this->ptr;
            this->ptr = pcVar5 + 1;
            *pcVar5 = cVar7;
            cVar7 = *pcVar10;
          }
          operator<<(this,s);
        }
        cVar7 = ')';
        lVar11 = 1;
        do {
          pcVar10 = this->ptr;
          this->ptr = pcVar10 + 1;
          *pcVar10 = cVar7;
          cVar7 = ")@("[lVar11];
          lVar11 = lVar11 + 1;
        } while (lVar11 != 4);
        operator<<(this,IVar3);
        goto LAB_0028c9e8;
      }
      if ((uVar9 & 1) == 0) {
        operator<<();
      }
      else {
        operator<<(this);
      }
      cVar7 = '@';
      lVar11 = 0;
      do {
        pcVar10 = this->ptr;
        this->ptr = pcVar10 + 1;
        *pcVar10 = cVar7;
        cVar7 = ")@("[lVar11 + 2];
        lVar11 = lVar11 + 1;
      } while (lVar11 != 2);
      IVar6.raw = (int)sVar12;
      if (uVar14 == 3) {
        IVar6.raw = iVar2;
      }
      operator<<(this,IVar6);
      cVar7 = ')';
      lVar11 = 1;
      do {
        pcVar10 = this->ptr;
        this->ptr = pcVar10 + 1;
        *pcVar10 = cVar7;
        cVar7 = ")@("[lVar11];
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      operator<<(this,IVar3);
      if ((uVar13 & 1) != 0) goto LAB_0028c9e8;
      pcVar10 = this->ptr;
      this->ptr = pcVar10 + 1;
      *pcVar10 = ',';
      SVar4 = this->style->syntax;
      if ((SVar4 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar4 & 0x1f) & 1) != 0)) {
        pcVar10 = this->ptr;
        this->ptr = pcVar10 + 1;
        *pcVar10 = ' ';
      }
      operator<<(this,rn);
      pcVar10 = ":l";
      if ((uVar8 & 1) == 0) {
        pcVar10 = ":w";
      }
      cVar7 = *pcVar10;
      while (cVar7 != '\0') {
        pcVar10 = pcVar10 + 1;
        pcVar5 = this->ptr;
        this->ptr = pcVar5 + 1;
        *pcVar5 = cVar7;
        cVar7 = *pcVar10;
      }
    }
  }
  operator<<(this,s);
LAB_0028c9e8:
  pcVar10 = this->ptr;
  this->ptr = pcVar10 + 1;
  *pcVar10 = ')';
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(IxMit<M, S> wrapper)
{
    assert(M == Mode(6) || M == Mode(10));

    auto &ea = wrapper.ea;

    u16 full = _______x________ (ea.ext1);

    if (!full) {

        //   15-12   11   10   09   08   07   06   05   04   03   02   01   00
        // --------------------------------------------------------------------
        // | REG   | LW | SCALE   | 0  | DISPLACEMENT                         |
        // --------------------------------------------------------------------

        u16 reg   = xxxx____________ (ea.ext1);
        u16 lw    = ____x___________ (ea.ext1);
        u16 scale = _____xx_________ (ea.ext1);
        u16 disp  = ________xxxxxxxx (ea.ext1);

        M == Mode(10) ? *this << Pc{} : *this << An{ea.reg};
        *this << "@(" << Int{(i8)disp};
        *this << "," << Rn{reg} << (lw ? ":l" : ":w") << Scale{scale} << ")";

    } else {

        //   15-12   11   10   09   08   07   06   05   04   03   02   01   00
        // --------------------------------------------------------------------
        // | REG   | LW | SCALE   | 1  | BS | IS | BD SIZE  | 0  | IIS        |
        // --------------------------------------------------------------------

        u16  reg   = xxxx____________ (ea.ext1);
        u16  lw    = ____x___________ (ea.ext1);
        u16  scale = _____xx_________ (ea.ext1);
        u16  bs    = ________x_______ (ea.ext1);
        u16  is    = _________x______ (ea.ext1);
        u16  size  = __________xx____ (ea.ext1);
        u16  iis   = _____________xxx (ea.ext1);
        u32  base  = ea.ext2;
        u32  outer = ea.ext3;

        auto baseDisplacement = [&]() {
            size == 3 ? (*this << Int{(i32)base}) : (*this << Int{(i16)base});
        };
        auto baseRegister = [&]() {
            if constexpr (M == Mode(10)) {
                bs ? *this << Zpc{} : *this << Pc{};
            } else {
                if (!bs) *this << An{ea.reg};
            }
        };
        auto indexRegister = [&]() {
            if (!is) *this << Sep{} << Rn{reg} << (lw ? ":l" : ":w") << Scale{scale};
        };
        auto outerDisplacement = [&]() {
            *this << Int(outer);
        };

        if (iis == 0) {

            // Memory Indirect Unindexed
            baseRegister();
            *this << "@(";
            baseDisplacement(); indexRegister();
            *this << ")";

        } else if (iis & 0b100) {

            // Memory Indirect Postindexed
            baseRegister();
            *this << "@(";
            baseDisplacement();
            *this << ")@(";
            outerDisplacement(); indexRegister();
            *this << ")";

        } else {

            // Memory Indirect Preindexed
            baseRegister();
            *this << "@(";
            baseDisplacement(); indexRegister();
            *this << ")@(";
            outerDisplacement();
            *this << ")";
        }
    }

    return *this;
}